

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

int * Gia_ManTerCreateMap(Gia_ManTer_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  int *__s;
  Vec_Int_t *p_00;
  int *piVar6;
  ulong uVar7;
  Gia_Man_t *pGVar8;
  uint uVar9;
  size_t __size;
  int Entry;
  long lVar10;
  uint local_3c;
  
  uVar1 = p->vStates->nSize;
  pVVar5 = Gia_ManTerTranspose(p);
  p->vFlops = pVVar5;
  __size = (long)p->pAig->vCis->nSize << 2;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  pGVar8 = p->pAig;
  uVar7 = (ulong)(uint)pGVar8->nRegs;
  if (pGVar8->nRegs < 1) {
    uVar9 = 0;
    local_3c = 0;
  }
  else {
    lVar10 = 0;
    local_3c = 0;
    uVar9 = 0;
    do {
      Entry = (int)lVar10;
      if (p->pCount0[lVar10] == p->vStates->nSize) {
        __s[(pGVar8->vCis->nSize - (int)uVar7) + Entry] = 0;
        uVar9 = uVar9 + 1;
      }
      else if (p->pCountX[lVar10] == 0) {
        uVar3 = Gia_ManFindEqualFlop
                          (p->vFlops,p_00->nSize,
                           (((int)uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0));
        Vec_IntPush(p_00,Entry);
        if (-1 < (int)uVar3) {
          if (p_00->nSize <= (int)uVar3) {
LAB_0023d441:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pGVar8 = p->pAig;
          iVar2 = pGVar8->vCis->nSize;
          iVar4 = iVar2 - pGVar8->nRegs;
          uVar3 = p_00->pArray[uVar3] + iVar4;
          if (((int)uVar3 < 0) || (iVar2 <= (int)uVar3)) goto LAB_0023d441;
          iVar2 = pGVar8->vCis->pArray[uVar3];
          if ((iVar2 < 0) || (pGVar8->nObjs <= iVar2)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          __s[iVar4 + Entry] = iVar2 * 2;
          local_3c = local_3c + 1;
        }
      }
      lVar10 = lVar10 + 1;
      pGVar8 = p->pAig;
      uVar7 = (ulong)pGVar8->nRegs;
    } while (lVar10 < (long)uVar7);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (fVerbose != 0) {
    printf("Transforming %d const and %d equiv registers.\n",(ulong)uVar9,(ulong)local_3c);
  }
  return __s;
}

Assistant:

int * Gia_ManTerCreateMap( Gia_ManTer_t * p, int fVerbose )
{
    int * pCi2Lit;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMapKtoI;
    int i, iRepr, nFlopWords, Counter0 = 0, CounterE = 0;
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    p->vFlops = Gia_ManTerTranspose( p );
    pCi2Lit = ABC_FALLOC( int, Gia_ManCiNum(p->pAig) );
    vMapKtoI = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) )
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = 0, Counter0++;
        else if ( p->pCountX[i] == 0 )
        {
            iRepr = Gia_ManFindEqualFlop( p->vFlops, Vec_IntSize(vMapKtoI), nFlopWords );
            Vec_IntPush( vMapKtoI, i );
            if ( iRepr < 0 )
                continue;
            pObj = Gia_ManCi( p->pAig, Gia_ManPiNum(p->pAig)+Vec_IntEntry(vMapKtoI, iRepr) );
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = Abc_Var2Lit( Gia_ObjId( p->pAig, pObj ), 0 );
            CounterE++;
        }
    Vec_IntFree( vMapKtoI );
    if ( fVerbose )
        printf( "Transforming %d const and %d equiv registers.\n", Counter0, CounterE );
    return pCi2Lit;
}